

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coolprop_tracer.h
# Opt level: O0

stepping_variable __thiscall
PyVLEIsolineTracer<double>::determine_integration_type(PyVLEIsolineTracer<double> *this)

{
  bool bVar1;
  object local_68;
  object o;
  function overload;
  gil_scoped_acquire gil;
  undefined1 local_38 [8];
  gil_scoped_acquire acquire;
  gil_scoped_release release;
  PyVLEIsolineTracer<double> *this_local;
  
  pybind11::gil_scoped_release::gil_scoped_release((gil_scoped_release *)&acquire.release,false);
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)local_38);
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)&overload);
  pybind11::get_overload<VLEIsolineTracer<double>>
            ((pybind11 *)&o,&this->super_VLEIsolineTracer<double>,"determine_integration_type");
  bVar1 = pybind11::handle::operator_cast_to_bool(&o.super_handle);
  if (bVar1) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_68);
    this_local._4_4_ =
         pybind11::detail::cast_safe<AbstractIsolineTracer<double>::stepping_variable>(&local_68);
    pybind11::object::~object(&local_68);
  }
  pybind11::function::~function((function *)&o);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)&overload);
  if (!bVar1) {
    this_local._4_4_ =
         AbstractIsolineTracer<double>::determine_integration_type
                   ((AbstractIsolineTracer<double> *)this);
  }
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)local_38);
  pybind11::gil_scoped_release::~gil_scoped_release((gil_scoped_release *)&acquire.release);
  return this_local._4_4_;
}

Assistant:

stepping_variable determine_integration_type() override{
        // Release the GIL
        py::gil_scoped_release release;
        {
            // Acquire GIL before calling Python code
            py::gil_scoped_acquire acquire;

            // Parameters to macro are: Return type, parent class, name of function in C++, argument(s)
            PYBIND11_OVERLOAD(stepping_variable,
                VLEIsolineTracer,
                determine_integration_type,
                // No arguments
                );
        }
    }